

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

void __thiscall
pstore::small_vector<unsigned_char,128ul>::assign<unsigned_char_const*>
          (small_vector<unsigned_char,128ul> *this,uchar *first,uchar *last)

{
  uchar *last_local;
  uchar *first_local;
  small_vector<unsigned_char,_128UL> *this_local;
  
  small_vector<unsigned_char,_128UL>::clear((small_vector<unsigned_char,_128UL> *)this);
  for (last_local = first; last_local != last; last_local = last_local + 1) {
    small_vector<unsigned_char,_128UL>::push_back
              ((small_vector<unsigned_char,_128UL> *)this,last_local);
  }
  return;
}

Assistant:

void small_vector<ElementType, BodyElements>::assign (InputIt first, InputIt last) {
        this->clear ();
        for (; first != last; ++first) {
            this->push_back (*first);
        }
    }